

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryPacking.cpp
# Opt level: O2

bool __thiscall
wasm::MemoryPacking::canOptimize
          (MemoryPacking *this,
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          *memories,
          vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
          *dataSegments)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  DataSegment *pDVar4;
  Expression *pEVar5;
  bool bVar6;
  Const *pCVar7;
  Address AVar8;
  ostream *poVar9;
  iterator __begin1;
  pointer puVar10;
  bool bVar11;
  Span span;
  undefined1 local_58 [8];
  DisjointSpans space;
  
  puVar1 = (memories->
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (memories->
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)((long)puVar2 - (long)puVar1) < 9 && puVar2 != puVar1) &&
     ((*(char **)((long)&(((puVar1->_M_t).
                           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                         super_Importable).module + 8) == (char *)0x0 ||
      ((((this->super_Pass).runner)->options).zeroFilledMemory == true)))) {
    puVar10 = (dataSegments->
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (dataSegments->
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = true;
    if (8 < (ulong)((long)puVar3 - (long)puVar10)) {
      for (; puVar10 != puVar3; puVar10 = puVar10 + 1) {
        pDVar4 = (puVar10->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar4->isPassive == false) {
          pEVar5 = pDVar4->offset;
          if (pEVar5->_id != ConstId) goto LAB_008adfa9;
          Literal::getUnsigned((Literal *)(pEVar5 + 1));
        }
      }
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&space;
      space.spans._M_t._M_impl._0_4_ = 0;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      puVar3 = (dataSegments->
               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           space.spans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      for (puVar10 = (dataSegments->
                     super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; bVar11 = puVar10 == puVar3, !bVar11
          ; puVar10 = puVar10 + 1) {
        pDVar4 = (puVar10->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar4->isPassive == false) {
          pCVar7 = Expression::cast<wasm::Const>(pDVar4->offset);
          AVar8.addr = Literal::getUnsigned(&pCVar7->value);
          pDVar4 = (puVar10->_M_t).
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
          span.right.addr =
               (long)*(pointer *)
                      ((long)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_> + 8) +
               (AVar8.addr -
               *(long *)&(pDVar4->data).super__Vector_base<char,_std::allocator<char>_>._M_impl);
          span.left.addr = AVar8.addr;
          bVar6 = DisjointSpans::addAndCheckOverlap((DisjointSpans *)local_58,span);
          if (bVar6) {
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "warning: active memory segments have overlap, which ");
            std::operator<<(poVar9,"prevents some optimizations.\n");
            break;
          }
        }
      }
      std::
      _Rb_tree<wasm::DisjointSpans::Span,_wasm::DisjointSpans::Span,_std::_Identity<wasm::DisjointSpans::Span>,_wasm::DisjointSpans::SortByLeft,_std::allocator<wasm::DisjointSpans::Span>_>
      ::~_Rb_tree((_Rb_tree<wasm::DisjointSpans::Span,_wasm::DisjointSpans::Span,_std::_Identity<wasm::DisjointSpans::Span>,_wasm::DisjointSpans::SortByLeft,_std::allocator<wasm::DisjointSpans::Span>_>
                   *)local_58);
    }
  }
  else {
LAB_008adfa9:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool MemoryPacking::canOptimize(
  std::vector<std::unique_ptr<Memory>>& memories,
  std::vector<std::unique_ptr<DataSegment>>& dataSegments) {
  if (memories.empty() || memories.size() > 1) {
    return false;
  }
  auto& memory = memories[0];
  // We must optimize under the assumption that memory has been initialized to
  // zero. That is the case for a memory declared in the module, but for a
  // memory that is imported, we must be told that it is zero-initialized.
  if (memory->imported() && !getPassOptions().zeroFilledMemory) {
    return false;
  }

  // One segment is always ok to optimize, as it does not have the potential
  // problems handled below.
  if (dataSegments.size() <= 1) {
    return true;
  }
  // Check if it is ok for us to optimize.
  Address maxAddress = 0;
  for (auto& segment : dataSegments) {
    if (!segment->isPassive) {
      auto* c = segment->offset->dynCast<Const>();
      // If an active segment has a non-constant offset, then what gets written
      // cannot be known until runtime. That is, the active segments are written
      // out at startup, in order, and one may trample the data of another, like
      //
      //  (data (i32.const 100) "a")
      //  (data (i32.const 100) "\00")
      //
      // It is *not* ok to optimize out the zero in the last segment, as it is
      // actually needed, it will zero out the "a" that was written earlier. And
      // if a segment has an imported offset,
      //
      //  (data (i32.const 100) "a")
      //  (data (global.get $x) "\00")
      //
      // then we can't tell if that last segment will end up overwriting or not.
      // The only case we can easily handle is if there is just a single
      // segment, which we handled earlier. (Note that that includes the main
      // case of having a non-constant offset, dynamic linking, in which we have
      // a single segment.)
      if (!c) {
        return false;
      }
      // Note the maximum address so far.
      maxAddress = std::max(
        maxAddress, Address(c->value.getUnsigned() + segment->data.size()));
    }
  }
  // All active segments have constant offsets, known at this time, so we may be
  // able to optimize, but must still check for the trampling problem mentioned
  // earlier.
  // TODO: optimize in the trampling case
  DisjointSpans space;
  for (auto& segment : dataSegments) {
    if (!segment->isPassive) {
      auto* c = segment->offset->cast<Const>();
      Address start = c->value.getUnsigned();
      DisjointSpans::Span span{start, start + segment->data.size()};
      if (space.addAndCheckOverlap(span)) {
        std::cerr << "warning: active memory segments have overlap, which "
                  << "prevents some optimizations.\n";
        return false;
      }
    }
  }
  return true;
}